

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O1

int CTcLibParserCmdline::process_lib_arg
              (CTcHostIfc *hostifc,CTcMake *mk,CRcResList *res_list,char *lib_name,char *lib_url,
              int *nodef)

{
  CTcLibParserCmdline parser;
  char full_name [4096];
  char path [4096];
  CTcLibParserCmdline local_2090;
  char local_2038 [4096];
  char local_1038 [4104];
  
  strcpy(local_2038,lib_name);
  os_defext(local_2038,"tl");
  os_get_path_name(local_1038,0x1000,lib_name);
  CTcMake::maybe_add_include_path(mk,local_1038);
  CTcLibParserCmdline(&local_2090,hostifc,mk,res_list,local_2038,lib_url);
  CTcLibParser::parse_lib(&local_2090.super_CTcLibParser);
  *nodef = local_2090.nodef_;
  ~CTcLibParserCmdline(&local_2090);
  return local_2090.super_CTcLibParser.err_cnt_;
}

Assistant:

static int process_lib_arg(CTcHostIfc *hostifc, CTcMake *mk,
                               CRcResList *res_list,
                               const char *lib_name, const char *lib_url,
                               int *nodef)
    {
        char path[OSFNMAX];
        char full_name[OSFNMAX];

        /* add a default "tl" extension to the library name */
        strcpy(full_name, lib_name);
        os_defext(full_name, "tl");

        /* extract the path name from the library's name */
        os_get_path_name(path, sizeof(path), lib_name);

        /* 
         *   add the directory containing the library to the include path,
         *   if it's not already there 
         */
        mk->maybe_add_include_path(path);

        /* set up our library parser object */
        CTcLibParserCmdline parser(hostifc, mk, res_list, full_name, lib_url);

        /* scan the library and add its files to the command line */
        parser.parse_lib();

        /* set the 'nodef' indication for the caller */
        *nodef = parser.nodef_;

        /* if there are any errors, return non-zero */
        return parser.get_err_cnt();
    }